

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O1

void __thiscall BMP::writeFrequencyProbability(BMP *this,ofstream *out)

{
  pointer pcVar1;
  long lVar2;
  uint uVar3;
  longdouble lVar4;
  longdouble lVar5;
  ostream *poVar6;
  GreyCount *pGVar7;
  long lVar8;
  GreyCount *pGVar9;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined1 *local_58 [2];
  undefined1 local_48 [24];
  
  lVar8 = (long)this->alphabet->num;
  if (lVar8 != 0) {
    pGVar7 = this->alphabet->symbol;
    pGVar9 = pGVar7 + lVar8;
    do {
      uVar3 = *(uint *)&pGVar7->tone;
      lVar5 = pGVar7->frq;
      lVar4 = pGVar7->frq;
      local_98[0] = local_88;
      pcVar1 = (pGVar7->uniformCodes)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_98,pcVar1,pcVar1 + (pGVar7->uniformCodes)._M_string_length);
      local_78[0] = local_68;
      pcVar1 = (pGVar7->codeShannonFano)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_78,pcVar1,pcVar1 + (pGVar7->codeShannonFano)._M_string_length);
      pcVar1 = (pGVar7->codeHuffman)._M_dataplus._M_p;
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,pcVar1,pcVar1 + (pGVar7->codeHuffman)._M_string_length);
      lVar8 = std::cout;
      if (out == (ofstream *)0x0) {
        *(undefined8 *)(std::ofstream::close + *(long *)(std::cout + -0x18)) = 8;
        lVar2 = *(long *)(lVar8 + -0x18);
        *(uint *)(__cxa_rethrow + lVar2) = *(uint *)(__cxa_rethrow + lVar2) & 0xfffffefb | 4;
        *(undefined8 *)(operator_delete__ + *(long *)(lVar8 + -0x18)) = 5;
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar3 & 0xff);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
        poVar6 = std::ostream::_M_insert<long_double>(lVar5);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      }
      else {
        lVar8 = *(long *)out;
        *(undefined8 *)(out + *(long *)(lVar8 + -0x18) + 0x10) = 8;
        *(uint *)(out + *(long *)(lVar8 + -0x18) + 0x18) =
             *(uint *)(out + *(long *)(lVar8 + -0x18) + 0x18) & 0xfffffefb | 4;
        *(undefined8 *)(out + *(long *)(lVar8 + -0x18) + 8) = 5;
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)out,uVar3 & 0xff);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
        poVar6 = std::ostream::_M_insert<long_double>(lVar4);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      }
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      if (local_58[0] != local_48) {
        operator_delete(local_58[0]);
      }
      if (local_78[0] != local_68) {
        operator_delete(local_78[0]);
      }
      if (local_98[0] != local_88) {
        operator_delete(local_98[0]);
      }
      pGVar7 = pGVar7 + 1;
    } while (pGVar7 != pGVar9);
  }
  return;
}

Assistant:

void BMP::writeFrequencyProbability( std::ofstream *out )
{
    using namespace std;
    bool flag;
    if ( out != nullptr )
        flag = true;
    else
        flag = false;

    for_each( alphabet->symbol, alphabet->symbol+alphabet->num, [ & ]( bitMap::GreyCount a ){
        if ( flag ) {
            ( *out ) << setw( 8 ) << fixed << setprecision( 5 ) << ( int ) a.tone << ": " << a.frq << endl;
        } else {
            cout << setw( 8 ) << fixed << setprecision( 5 ) << ( int ) a.tone << ": " << a.frq << endl;
        }
    });
}